

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day25.cpp
# Opt level: O1

void day25(input_t input)

{
  pointer pSVar1;
  undefined4 uVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  undefined1 auVar6 [32];
  pointer pSVar7;
  ulong uVar8;
  pointer pSVar9;
  pointer pSVar10;
  unsigned_short __old_val_1;
  uint uVar11;
  ulong uVar12;
  uint16_t uVar13;
  size_t __new_size;
  uint uVar14;
  ushort uVar15;
  uint uVar16;
  unsigned_short __old_val;
  int iVar17;
  long lVar18;
  ulong uVar19;
  _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
  *p_Var20;
  uint uVar21;
  Set *pSVar22;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> V;
  byte local_69;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [16];
  pointer local_48;
  ulong local_38;
  
  local_58 = (undefined1  [16])0x0;
  local_48 = (pointer)0x0;
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::reserve
            ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
             local_58,0x2000);
  if (input.len != 0) {
    lVar18 = 0;
    bVar23 = false;
    do {
      cVar3 = input.s[lVar18];
      if ((byte)(cVar3 - 0x30U) < 10) {
        local_69 = cVar3 - 0x30U;
        if (bVar23) {
          local_69 = 0x30 - cVar3;
        }
        std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::
        emplace_back<signed_char>
                  ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
                   local_58,(char *)&local_69);
        bVar23 = false;
      }
      else if (cVar3 == '-') {
        bVar23 = true;
      }
      lVar18 = lVar18 + 1;
    } while (input.len != lVar18);
  }
  uVar12 = local_58._8_8_ - local_58._0_8_;
  __new_size = uVar12 + 0x1f & 0xffffffffffffffe0;
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::resize
            ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
             local_58,__new_size);
  uVar19 = uVar12 >> 2;
  p_Var20 = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
             *)(uVar19 & 0xffff);
  if (p_Var20 ==
      (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
       *)0x0) {
    pSVar7 = (pointer)0x0;
    local_68 = (pointer)0x0;
  }
  else {
    pSVar7 = std::
             _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
             ::_M_allocate(p_Var20,__new_size);
    local_68 = pSVar7 + (long)p_Var20;
  }
  local_38 = uVar12;
  if ((uint16_t)uVar19 != 0) {
    uVar13 = 0;
    pSVar10 = pSVar7;
    do {
      if (pSVar10 == local_68) {
        lVar18 = (long)pSVar10 - (long)pSVar7;
        if (lVar18 == 0x7ffffffffffffffc) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar8 = lVar18 >> 2;
        uVar12 = uVar8;
        if (pSVar10 == pSVar7) {
          uVar12 = 1;
        }
        p_Var20 = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                   *)(uVar12 + uVar8);
        if ((_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
             *)0x1ffffffffffffffe < p_Var20) {
          p_Var20 = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                     *)0x1fffffffffffffff;
        }
        if (CARRY8(uVar12,uVar8)) {
          p_Var20 = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                     *)0x1fffffffffffffff;
        }
        local_60 = pSVar7;
        pSVar7 = std::
                 _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                 ::_M_allocate(p_Var20,1);
        *(uint16_t *)((long)pSVar7 + lVar18) = uVar13;
        *(undefined2 *)((long)pSVar7 + lVar18 + 2) = 0;
        pSVar22 = pSVar7;
        for (pSVar9 = local_60; pSVar10 != pSVar9; pSVar9 = pSVar9 + 1) {
          *pSVar22 = *pSVar9;
          pSVar22 = pSVar22 + 1;
        }
        if (local_60 != (pointer)0x0) {
          operator_delete(local_60,(long)local_68 - (long)local_60);
        }
        local_68 = pSVar7 + (long)p_Var20;
      }
      else {
        pSVar10->parent = uVar13;
        pSVar10->rank = 0;
        pSVar22 = pSVar10;
      }
      pSVar10 = pSVar22 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint16_t)uVar19);
  }
  if ((local_38 & 0x3fffffff8) == 0) {
LAB_00113dc5:
    printf("Day 25 Part 1: %u\n",uVar19 & 0xffff);
    if (pSVar7 != (pointer)0x0) {
      operator_delete(pSVar7,(long)local_68 - (long)pSVar7);
    }
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      free((void *)local_58._0_8_);
    }
    return;
  }
  local_60 = (pointer)(uVar19 & 0xffffffff);
  pSVar10 = (pointer)0x1;
  auVar24._8_4_ = 0x1010101;
  auVar24._0_8_ = 0x101010101010101;
  auVar24._12_4_ = 0x1010101;
  auVar24._16_4_ = 0x1010101;
  auVar24._20_4_ = 0x1010101;
  auVar24._24_4_ = 0x1010101;
  auVar24._28_4_ = 0x1010101;
  auVar25._8_4_ = 0x3ffffff;
  auVar25._0_8_ = 0x3ffffff03ffffff;
  auVar25._12_4_ = 0x3ffffff;
  auVar25._16_4_ = 0x3ffffff;
  auVar25._20_4_ = 0x3ffffff;
  auVar25._24_4_ = 0x3ffffff;
  auVar25._28_4_ = 0x3ffffff;
LAB_00113c99:
  uVar2 = *(undefined4 *)(local_58._0_8_ + (long)pSVar10 * 4);
  auVar26._4_4_ = uVar2;
  auVar26._0_4_ = uVar2;
  auVar26._8_4_ = uVar2;
  auVar26._12_4_ = uVar2;
  auVar26._16_4_ = uVar2;
  auVar26._20_4_ = uVar2;
  auVar26._24_4_ = uVar2;
  auVar26._28_4_ = uVar2;
  uVar12 = 0;
  do {
    auVar6 = vpsubb_avx2(auVar26,*(undefined1 (*) [32])(local_58._0_8_ + uVar12 * 0x20));
    auVar6 = vpabsb_avx2(auVar6);
    auVar6 = vpmulld_avx2(auVar6,auVar24);
    auVar6 = vpcmpgtd_avx2(auVar6,auVar25);
    uVar14 = ((uint)(SUB321(auVar6 >> 7,0) & 1) | (uint)(SUB321(auVar6 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar6 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar6 >> 0x1f,0) & 1) << 3
              | (uint)(SUB321(auVar6 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar6 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar6 >> 0x37,0) & 1) << 6
              | (uint)(SUB321(auVar6 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar6 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar6 >> 0x4f,0) & 1) << 9
              | (uint)(SUB321(auVar6 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar6 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar6 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar6 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar6 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar6 >> 0x7f,0) << 0xf |
              (uint)(SUB321(auVar6 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar6 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar6 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar6 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar6 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar6 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar6 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar6 >> 0xbf,0) << 0x17
              | (uint)(SUB321(auVar6 >> 199,0) & 1) << 0x18 |
              (uint)(SUB321(auVar6 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar6 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar6 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar6 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar6 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar6 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar6[0x1f] >> 7) << 0x1f
             ) ^ 0xffffffff;
    if (uVar14 != 0) {
      uVar14 = uVar14 & 0x11111111;
      do {
        uVar16 = 0;
        for (uVar11 = uVar14; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x80000000) {
          uVar16 = uVar16 + 1;
        }
        uVar16 = (uVar16 >> 2) + (int)uVar12 * 8;
        iVar17 = 0xd;
        if (pSVar10 != (pointer)(ulong)uVar16) {
          uVar15 = pSVar7[(ulong)pSVar10 & 0xffff].parent;
          uVar11 = (uint)pSVar10;
          pSVar9 = pSVar7 + ((ulong)pSVar10 & 0xffff);
          if (uVar15 != (ushort)pSVar10) {
            do {
              uVar11 = (uint)uVar15;
              pSVar1 = pSVar7 + uVar11;
              pSVar9->parent = pSVar1->parent;
              bVar23 = pSVar1->parent != uVar15;
              pSVar9 = pSVar1;
              uVar15 = pSVar1->parent;
            } while (bVar23);
          }
          uVar15 = (ushort)uVar16;
          if (pSVar7[uVar15].parent != uVar15) {
            pSVar9 = pSVar7 + uVar15;
            uVar4 = pSVar7[uVar15].parent;
            do {
              uVar15 = uVar4;
              pSVar1 = pSVar7 + uVar15;
              pSVar9->parent = pSVar1->parent;
              pSVar9 = pSVar1;
              uVar4 = pSVar1->parent;
            } while (pSVar1->parent != uVar15);
          }
          if ((uint16_t)uVar11 != uVar15) {
            uVar19 = (ulong)((int)uVar19 - 1);
            uVar21 = uVar11 & 0xffff;
            uVar4 = pSVar7[uVar21].rank;
            uVar5 = pSVar7[uVar15].rank;
            if (uVar4 < uVar5) {
              pSVar7[uVar21].parent = uVar15;
            }
            else {
              pSVar7[uVar15].parent = (uint16_t)uVar11;
              if (uVar4 == uVar5) {
                pSVar7[uVar21].rank = uVar4 + 1;
              }
            }
          }
          uVar14 = uVar14 - 1 & uVar14;
          iVar17 = 0;
        }
        if (pSVar10 == (pointer)(ulong)uVar16) goto LAB_00113dab;
      } while (uVar14 != 0);
      iVar17 = 0;
LAB_00113dab:
      if (iVar17 != 0) break;
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  } while( true );
  pSVar10 = (pointer)((long)&pSVar10->parent + 1);
  if (pSVar10 == local_60) goto LAB_00113dc5;
  goto LAB_00113c99;
}

Assistant:

void day25(input_t input) {
	std::vector<int8_t, aligned_allocator<int8_t, alignof(__m256i)>> V;
	V.reserve(8192);

	for (uint8_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			V.push_back(n ? -c : c);
			n = 0;
		} else if (*input.s == '-') {
			n = 1;
		}
	}

	uint32_t n_points = V.size() / 4;

	// Pad to nearest multiple of AVX2 vector size
	V.resize((V.size() + 31ULL) & ~31ULL);
	uint32_t n_vectors = V.size() / 32;

	DisjointSet S(n_points);

	auto p32  = (uint32_t *) &V[0];
	auto p256 = (__m256i  *) &V[0];

	// Pairwise measure distance between points
	for (uint32_t i = 1; i < n_points; i++) {
		__m256i v = _mm256_set1_epi32(p32[i]);

		// Compare this point against 8 points at a time
		for (uint32_t j = 0; ; j++) {
			// Absolute difference per coordinate
			__m256i d = _mm256_abs_epi8(_mm256_sub_epi8(v, p256[j]));
			// Horizontal sum of differences per point
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d, 16));
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d,  8));
			// Less than 4?
			d = _mm256_cmpgt_epi32(_mm256_set1_epi32(0x04000000), d);

			uint32_t m = _mm256_movemask_epi8(d);
			if (m) {
				m &= 0x11111111;
				uint32_t base = j * 8;
				do {
					uint32_t idx = base + _tzcnt_u32(m) / 4;
					if (idx == i) {
						goto next_point;
					}
					S.join(i, idx);
					m = _blsr_u32(m);
				} while (m);
			}
		}
next_point:;
	}
	printf("Day 25 Part 1: %u\n", S.trees);
}